

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O0

int skeinFinal(SkeinCtx_t *ctx,uint8_t *hash)

{
  u64b_t uVar1;
  int local_24;
  int ret;
  uint8_t *hash_local;
  SkeinCtx_t *ctx_local;
  
  local_24 = 1;
  if (ctx == (SkeinCtx_t *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    uVar1 = ctx->skeinSize;
    if (uVar1 == 0x100) {
      local_24 = Skein_256_Final(&(ctx->m).s256,hash);
    }
    else if (uVar1 == 0x200) {
      local_24 = Skein_512_Final(&(ctx->m).s512,hash);
    }
    else if (uVar1 == 0x400) {
      local_24 = Skein1024_Final(&(ctx->m).s1024,hash);
    }
    ctx_local._4_4_ = local_24;
  }
  return ctx_local._4_4_;
}

Assistant:

int skeinFinal(SkeinCtx_t* ctx, uint8_t* hash)
{
    int ret = SKEIN_FAIL;
    Skein_Assert(ctx, SKEIN_FAIL);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_Final(&ctx->m.s256, (u08b_t*)hash);
        break;
    case Skein512:
        ret = Skein_512_Final(&ctx->m.s512, (u08b_t*)hash);
        break;
    case Skein1024:
        ret = Skein1024_Final(&ctx->m.s1024, (u08b_t*)hash);
        break;
    }
    return ret;
}